

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall soplex::CLUFactorRational::selectPivots(CLUFactorRational *this,Rational *threshold)

{
  pointer pnVar1;
  Pring *pPVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Pring *pPVar9;
  long lVar10;
  int iVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar20;
  data_type *o;
  CLUFactorRational *pCVar21;
  long lVar22;
  data_type *this_00;
  type t;
  Rational l_maxabs;
  Rational x;
  abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>
  local_409;
  data_type local_408;
  uint local_3f8;
  undefined1 local_3f4;
  char local_3f3;
  char local_3f2;
  data_type local_3e8;
  uint local_3d8;
  undefined1 local_3d4;
  char local_3d3;
  char local_3d2;
  data_type local_3c8;
  uint local_3b8;
  undefined2 local_3b4;
  char local_3b2;
  data_type local_3a8;
  uint local_398;
  undefined2 local_394;
  char local_392;
  long local_380;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_378;
  int local_368;
  int local_364;
  CLUFactorRational *local_360;
  long local_358;
  ulong local_350;
  int local_348;
  int local_344;
  ulong local_340;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  data_type local_328;
  char local_313;
  char local_312;
  data_type local_308;
  char local_2f3;
  char local_2f2;
  ulong local_2e0;
  long local_2d8;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_2d0;
  Pring *local_2c8;
  long local_2c0;
  data_type local_2b8;
  char local_2a3;
  char local_2a2;
  uint local_298;
  void *local_290;
  char local_283;
  char local_282;
  data_type local_278;
  char local_263;
  char local_262;
  uint local_258;
  void *local_250;
  char local_243;
  char local_242;
  data_type local_238;
  char local_223;
  char local_222;
  uint local_218;
  void *local_210;
  char local_203;
  char local_202;
  data_type local_1f8;
  char local_1e3;
  char local_1e2;
  uint local_1d8;
  void *local_1d0;
  char local_1c3;
  char local_1c2;
  data_type local_1b8;
  char local_1a3;
  char local_1a2;
  uint local_198;
  void *local_190;
  char local_183;
  char local_182;
  data_type local_178;
  char local_163;
  char local_162;
  uint local_158;
  void *local_150;
  char local_143;
  char local_142;
  data_type local_138;
  char local_123;
  char local_122;
  uint local_118;
  void *local_110;
  char local_103;
  char local_102;
  data_type local_f8;
  char local_e3;
  char local_e2;
  uint local_d8;
  void *local_d0;
  char local_c3;
  char local_c2;
  data_type local_b8;
  char local_a3;
  char local_a2;
  uint local_98;
  void *local_90;
  char local_83;
  char local_82;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  
  local_3c8.la[0] = 0;
  local_3b8 = 1;
  local_3b4 = 0x100;
  local_3b2 = '\0';
  local_3a8.la[0] = 1;
  local_398 = 1;
  local_394 = 0x100;
  local_392 = '\0';
  local_2e0 = 0;
  local_408.la[0] = 0;
  local_2d0 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)threshold;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_328.ld,(longlong *)local_408.la,(type *)0x0);
  iVar5 = ~(this->temp).stage + this->thedim;
  local_338 = 4;
  if (iVar5 < 4) {
    local_338 = iVar5;
  }
  local_2c8 = &(this->temp).pivots;
  uVar14 = 2;
  local_348 = -1;
  local_368 = -1;
  iVar5 = -1;
  local_360 = this;
LAB_00189190:
  pPVar9 = (this->temp).pivot_rowNZ;
  iVar6 = (int)uVar14;
  pPVar13 = pPVar9[iVar6].next;
  pPVar9 = pPVar9 + iVar6;
  if (pPVar13 == pPVar9) {
    pPVar12 = (this->temp).pivot_colNZ + iVar6;
    do {
      if (pPVar12 != pPVar12->next) {
        iVar5 = pPVar12->next->idx;
        iVar6 = (this->temp).s_cact[iVar5];
        local_358 = CONCAT44(local_358._4_4_,this->thedim + 1);
        if (iVar6 < 1) {
          iVar6 = -1;
          goto LAB_0018a64b;
        }
        iVar11 = (this->u).col.len[iVar5] + (this->u).col.start[iVar5] + -1;
        local_334 = (int)uVar14 + 1;
        lVar18 = (long)iVar11;
        lVar19 = (long)(iVar11 - iVar6);
        local_344 = -1;
        local_364 = iVar5;
        local_340 = uVar14;
        local_2d8 = lVar19;
        goto LAB_001893f3;
      }
      pPVar13 = pPVar9[1].next;
      pPVar9 = pPVar9 + 1;
      uVar14 = (ulong)((int)uVar14 + 1);
      pPVar12 = pPVar12 + 1;
    } while (pPVar9 == pPVar13);
  }
  local_368 = pPVar13->idx;
  lVar18 = (long)local_368;
  local_380 = (long)(this->u).row.start[lVar18];
  local_350 = (ulong)(uint)(this->u).row.len[lVar18];
  pnVar1 = (this->temp).s_max.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_378.arg1 =
       (abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>
        *)0x0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_408.ld,(longlong *)&local_378,(type *)0x0);
  lVar19 = lVar18 * 0x40;
  iVar6 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&pnVar1[lVar18].m_backend,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)&local_408.ld);
  if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
    operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
  }
  if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
    operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
  }
  local_344 = (int)local_380 + (int)local_350 + -1;
  local_364 = iVar5;
  local_340 = uVar14;
  if (iVar6 < 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_78.ld,
                       &(this->u).row.val.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_344].m_backend);
    local_378.arg1 = &local_409;
    local_378.arg2 = (type)&local_78;
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                *)&local_408.ld,&local_378,(type *)0x0);
    if ((local_3b4._1_1_ == '\0') && (local_3b2 == '\0')) {
      operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
    }
    local_3b8 = local_3f8;
    local_3b4 = CONCAT11(local_3f3,local_3f4);
    local_3b2 = local_3f2;
    if (local_3f3 == '\x01') {
      memcpy(&local_3c8,&local_408,(ulong)local_3f8 << 3);
    }
    else {
      local_3c8.la[0] = local_408.la[0];
      local_3c8.ld.data = local_408.ld.data;
      local_3f8 = 0;
      local_3f3 = '\x01';
    }
    local_358 = lVar19;
    if ((local_394._1_1_ == '\0') && (local_392 == '\0')) {
      operator_delete(local_3a8.ld.data,(local_3a8.la[0] & 0xffffffff) << 3);
    }
    cVar4 = local_3d2;
    cVar3 = local_3d3;
    local_398 = local_3d8;
    local_394 = CONCAT11(local_3d3,local_3d4);
    local_392 = local_3d2;
    if (local_3d3 == '\0') {
      local_3a8.la[0] = CONCAT44(local_3e8.la[0]._4_4_,local_3e8.ld.capacity);
      local_3a8.ld.data = local_3e8.ld.data;
      local_3d8 = 0;
      local_3d3 = '\x01';
    }
    else {
      memcpy(&local_3a8,&local_3e8,(ulong)local_3d8 << 3);
      if ((cVar3 == '\0') && (cVar4 == '\0')) {
        operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
      }
    }
    if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
      operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
    }
    if ((local_43 == '\0') && (local_42 == '\0')) {
      operator_delete(local_50,(ulong)local_58 << 3);
    }
    if ((local_63 == '\0') && (local_62 == '\0')) {
      operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
    }
    iVar5 = (int)local_350 + (int)local_380 + -2;
    if ((int)local_380 <= iVar5) {
      lVar18 = (long)iVar5 + 1;
      lVar19 = (long)iVar5 << 6;
      do {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_b8.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(((this->u).row.val.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                      m_value + lVar19));
        local_378.arg1 = &local_409;
        local_378.arg2 = (type)&local_b8;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_408.ld,&local_378,(type *)0x0);
        iVar5 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_3c8.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_408.ld);
        if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
          operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
        }
        if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
          operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
        }
        if ((local_83 == '\0') && (local_82 == '\0')) {
          operator_delete(local_90,(ulong)local_98 << 3);
        }
        if ((local_a3 == '\0') && (local_a2 == '\0')) {
          operator_delete(local_b8.ld.data,(ulong)local_b8.ld.capacity << 3);
        }
        if (iVar5 < 0) {
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((this->u).row.val.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                        m_value + lVar19));
          local_378.arg1 = &local_409;
          local_378.arg2 = (type)&local_f8;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_408.ld,&local_378,(type *)0x0);
          if ((local_3b4._1_1_ == '\0') && (local_3b2 == '\0')) {
            operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
          }
          local_3b8 = local_3f8;
          local_3b4 = CONCAT11(local_3f3,local_3f4);
          local_3b2 = local_3f2;
          if (local_3f3 == '\x01') {
            memcpy(&local_3c8,&local_408,(ulong)local_3f8 << 3);
          }
          else {
            local_3c8.la[0] = local_408.la[0];
            local_3c8.ld.data = local_408.ld.data;
            local_3f8 = 0;
            local_3f3 = '\x01';
          }
          if ((local_394._1_1_ == '\0') && (local_392 == '\0')) {
            operator_delete(local_3a8.ld.data,(local_3a8.la[0] & 0xffffffff) << 3);
          }
          cVar4 = local_3d2;
          cVar3 = local_3d3;
          local_398 = local_3d8;
          local_394 = CONCAT11(local_3d3,local_3d4);
          local_392 = local_3d2;
          if (local_3d3 == '\0') {
            local_3a8.la[0] = CONCAT44(local_3e8.la[0]._4_4_,local_3e8.ld.capacity);
            local_3a8.ld.data = local_3e8.ld.data;
            local_3d8 = 0;
            local_3d3 = '\x01';
            this = local_360;
          }
          else {
            memcpy(&local_3a8,&local_3e8,(ulong)local_3d8 << 3);
            this = local_360;
            if ((cVar3 == '\0') && (cVar4 == '\0')) {
              operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
            }
          }
          if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
            operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
          }
          if ((local_c3 == '\0') && (local_c2 == '\0')) {
            operator_delete(local_d0,(ulong)local_d8 << 3);
          }
          if ((local_e3 == '\0') && (local_e2 == '\0')) {
            operator_delete(local_f8.ld.data,(ulong)local_f8.ld.capacity << 3);
          }
        }
        lVar18 = lVar18 + -1;
        lVar19 = lVar19 + -0x40;
      } while (local_380 < lVar18);
    }
    pcVar20 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)((long)&(((this->temp).s_max.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value +
                 local_358);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar20,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_3c8.ld);
    this_00 = &pcVar20[1].m_data;
    o = &local_3a8;
    uVar14 = local_340;
  }
  else {
    pcVar20 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)((this->temp).s_max.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar18);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_3c8.ld,pcVar20);
    o = &pcVar20[1].m_data;
    this_00 = &local_3a8;
  }
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&this_00->ld,
           (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&o->ld);
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_3c8.ld,local_2d0);
  local_358 = CONCAT44(local_358._4_4_,this->thedim + 1);
  if ((int)local_350 < 1) {
    iVar6 = -1;
    iVar5 = local_364;
  }
  else {
    lVar18 = (long)local_344 + 1;
    lVar19 = (long)local_344 << 6;
    local_350 = CONCAT44(local_350._4_4_,0xffffffff);
    iVar6 = local_344;
    do {
      pnVar1 = (this->u).row.val.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = (this->u).row.idx[lVar18 + -1];
      iVar11 = (this->temp).s_cact[iVar5];
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_328.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar1->m_backend).m_value + lVar19));
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_308.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar1->m_backend).m_value + lVar19 + 0x20));
      if (iVar11 < (int)local_358) {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_138.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_328.ld);
        local_378.arg1 = &local_409;
        local_378.arg2 = (type)&local_138;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_408.ld,&local_378,(type *)0x0);
        iVar7 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_408.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_3c8.ld);
        if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
          operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
        }
        if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
          operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
        }
        if ((local_103 == '\0') && (local_102 == '\0')) {
          operator_delete(local_110,(ulong)local_118 << 3);
        }
        if ((local_123 == '\0') && (local_122 == '\0')) {
          operator_delete(local_138.ld.data,(ulong)local_138.ld.capacity << 3);
        }
        if (0 < iVar7) {
          local_350 = CONCAT44(local_350._4_4_,iVar6);
          local_358 = CONCAT44(local_358._4_4_,iVar11);
          local_364 = iVar5;
          if (iVar11 <= (int)local_340) {
            local_358 = CONCAT44(local_358._4_4_,iVar11);
            uVar14 = local_340;
            this = local_360;
            goto LAB_0018a64b;
          }
        }
      }
      lVar18 = lVar18 + -1;
      lVar19 = lVar19 + -0x40;
      iVar6 = iVar6 + -1;
      this = local_360;
    } while (local_380 < lVar18);
    uVar14 = local_340;
    iVar5 = local_364;
    iVar6 = (int)local_350;
  }
  goto LAB_0018a64b;
LAB_001893f3:
  do {
    iVar6 = (this->u).col.idx[lVar18];
    iVar11 = (this->u).row.len[iVar6];
    if (iVar11 < (int)local_358) {
      pnVar1 = (this->temp).s_max.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_378.arg1 =
           (abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>
            *)0x0;
      local_380 = (long)iVar6;
      local_330 = iVar11;
      local_32c = iVar6;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_408.ld,(longlong *)&local_378,(type *)0x0);
      local_350 = local_380 * 0x40;
      iVar6 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare(&pnVar1[local_380].m_backend,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)&local_408.ld);
      if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
        operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
      }
      if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
        operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
      }
      iVar11 = (this->u).row.start[local_380];
      lVar19 = (long)iVar11;
      local_2c0 = lVar18;
      if (iVar6 < 1) {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_178.ld,
                           &(this->u).row.val.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend);
        local_378.arg1 = &local_409;
        local_378.arg2 = (type)&local_178;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_408.ld,&local_378,(type *)0x0);
        if ((local_3b4._1_1_ == '\0') && (local_3b2 == '\0')) {
          operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
        }
        local_3b8 = local_3f8;
        local_3b4 = CONCAT11(local_3f3,local_3f4);
        local_3b2 = local_3f2;
        if (local_3f3 == '\x01') {
          memcpy(&local_3c8,&local_408,(ulong)local_3f8 << 3);
        }
        else {
          local_3c8.la[0] = local_408.la[0];
          local_3c8.ld.data = local_408.ld.data;
          local_3f8 = 0;
          local_3f3 = '\x01';
        }
        if ((local_394._1_1_ == '\0') && (local_392 == '\0')) {
          operator_delete(local_3a8.ld.data,(local_3a8.la[0] & 0xffffffff) << 3);
        }
        cVar4 = local_3d2;
        cVar3 = local_3d3;
        local_398 = local_3d8;
        local_394 = CONCAT11(local_3d3,local_3d4);
        local_392 = local_3d2;
        if (local_3d3 == '\0') {
          local_3a8.la[0] = CONCAT44(local_3e8.la[0]._4_4_,local_3e8.ld.capacity);
          local_3a8.ld.data = local_3e8.ld.data;
          local_3d8 = 0;
          local_3d3 = '\x01';
        }
        else {
          memcpy(&local_3a8,&local_3e8,(ulong)local_3d8 << 3);
          if ((cVar3 == '\0') && (cVar4 == '\0')) {
            operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
          }
        }
        if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
          operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
        }
        if ((local_143 == '\0') && (local_142 == '\0')) {
          operator_delete(local_150,(ulong)local_158 << 3);
        }
        if ((local_163 == '\0') && (local_162 == '\0')) {
          operator_delete(local_178.ld.data,(ulong)local_178.ld.capacity << 3);
        }
        lVar16 = (long)((this->u).row.len[local_380] + iVar11);
        lVar18 = lVar16 << 0x20;
        lVar15 = lVar16 << 6;
        local_380 = lVar19;
        do {
          lVar22 = lVar15;
          lVar17 = lVar16;
          lVar10 = lVar18;
          if (lVar17 <= lVar19) goto LAB_00189b0c;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_1b8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(this->u).row.val.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                        m_value + lVar22));
          local_378.arg1 = &local_409;
          local_378.arg2 = (type)&local_1b8;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_408.ld,&local_378,(type *)0x0);
          iVar5 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_3c8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_408.ld);
          if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
            operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
          }
          if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
            operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
          }
          if ((local_183 == '\0') && (local_182 == '\0')) {
            operator_delete(local_190,(ulong)local_198 << 3);
          }
          if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
            operator_delete(local_1b8.ld.data,(ulong)local_1b8.ld.capacity << 3);
          }
          lVar19 = local_380;
          if (iVar5 < 0) {
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_1f8.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(this->u).row.val.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          m_value + lVar22));
            local_378.arg1 = &local_409;
            local_378.arg2 = (type)&local_1f8;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_408.ld,&local_378,(type *)0x0);
            if ((local_3b4._1_1_ == '\0') && (local_3b2 == '\0')) {
              operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
            }
            local_3b8 = local_3f8;
            local_3b4 = CONCAT11(local_3f3,local_3f4);
            local_3b2 = local_3f2;
            if (local_3f3 == '\x01') {
              memcpy(&local_3c8,&local_408,(ulong)local_3f8 << 3);
            }
            else {
              local_3c8.la[0] = local_408.la[0];
              local_3c8.ld.data = local_408.ld.data;
              local_3f8 = 0;
              local_3f3 = '\x01';
            }
            if ((local_394._1_1_ == '\0') && (local_392 == '\0')) {
              operator_delete(local_3a8.ld.data,(local_3a8.la[0] & 0xffffffff) << 3);
            }
            cVar4 = local_3d2;
            cVar3 = local_3d3;
            local_398 = local_3d8;
            local_394 = CONCAT11(local_3d3,local_3d4);
            local_392 = local_3d2;
            if (local_3d3 == '\0') {
              local_3a8.la[0] = CONCAT44(local_3e8.la[0]._4_4_,local_3e8.ld.capacity);
              local_3a8.ld.data = local_3e8.ld.data;
              local_3d8 = 0;
              local_3d3 = '\x01';
              this = local_360;
            }
            else {
              memcpy(&local_3a8,&local_3e8,(ulong)local_3d8 << 3);
              this = local_360;
              if ((cVar3 == '\0') && (cVar4 == '\0')) {
                operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
              }
            }
            if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
              operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
            }
            if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
              operator_delete(local_1d0,(ulong)local_1d8 << 3);
            }
            if ((local_1e3 == '\0') && (local_1e2 == '\0')) {
              operator_delete(local_1f8.ld.data,(ulong)local_1f8.ld.capacity << 3);
            }
          }
          lVar18 = lVar10 + -0x100000000;
          lVar16 = lVar17 + -1;
          lVar15 = lVar22 + -0x40;
        } while ((this->u).row.idx[lVar17 + -1] != local_364);
        pnVar1 = (this->u).row.val.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_328.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value + lVar22));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_308.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value + lVar22 + 0x20));
        local_348 = (int)(lVar17 + -1);
LAB_00189b0c:
        pCVar21 = local_360;
        if ((int)lVar19 < (int)lVar17 + -2) {
          lVar19 = (lVar10 >> 0x20) + -2;
          lVar18 = (lVar10 >> 0x1a) + -0x80;
          do {
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_238.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(((pCVar21->u).row.val.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          m_value + lVar18));
            local_378.arg1 = &local_409;
            local_378.arg2 = (type)&local_238;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_408.ld,&local_378,(type *)0x0);
            iVar5 = boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_3c8.ld,
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_408.ld);
            if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
              operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
            }
            if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
              operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
            }
            if ((local_203 == '\0') && (local_202 == '\0')) {
              operator_delete(local_210,(ulong)local_218 << 3);
            }
            if ((local_223 == '\0') && (local_222 == '\0')) {
              operator_delete(local_238.ld.data,(ulong)local_238.ld.capacity << 3);
            }
            lVar16 = local_380;
            if (iVar5 < 0) {
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_278.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((pCVar21->u).row.val.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_backend)
                                            .m_value + lVar18));
              local_378.arg1 = &local_409;
              local_378.arg2 = (type)&local_278;
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::
              number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                          *)&local_408.ld,&local_378,(type *)0x0);
              if ((local_3b4._1_1_ == '\0') && (local_3b2 == '\0')) {
                operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
              }
              local_3b8 = local_3f8;
              local_3b4 = CONCAT11(local_3f3,local_3f4);
              local_3b2 = local_3f2;
              if (local_3f3 == '\x01') {
                memcpy(&local_3c8,&local_408,(ulong)local_3f8 << 3);
              }
              else {
                local_3c8.la[0] = local_408.la[0];
                local_3c8.ld.data = local_408.ld.data;
                local_3f8 = 0;
                local_3f3 = '\x01';
              }
              if ((local_394._1_1_ == '\0') && (local_392 == '\0')) {
                operator_delete(local_3a8.ld.data,(local_3a8.la[0] & 0xffffffff) << 3);
              }
              cVar4 = local_3d2;
              cVar3 = local_3d3;
              local_398 = local_3d8;
              local_394 = CONCAT11(local_3d3,local_3d4);
              local_392 = local_3d2;
              if (local_3d3 == '\0') {
                local_3a8.la[0] = CONCAT44(local_3e8.la[0]._4_4_,local_3e8.ld.capacity);
                local_3a8.ld.data = local_3e8.ld.data;
                local_3d8 = 0;
                local_3d3 = '\x01';
                pCVar21 = local_360;
              }
              else {
                memcpy(&local_3a8,&local_3e8,(ulong)local_3d8 << 3);
                pCVar21 = local_360;
                if ((cVar3 == '\0') && (cVar4 == '\0')) {
                  operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
                }
              }
              if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
                operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
              }
              if ((local_243 == '\0') && (local_242 == '\0')) {
                operator_delete(local_250,(ulong)local_258 << 3);
              }
              if ((local_263 == '\0') && (local_262 == '\0')) {
                operator_delete(local_278.ld.data,(ulong)local_278.ld.capacity << 3);
              }
            }
            lVar19 = lVar19 + -1;
            lVar18 = lVar18 + -0x40;
          } while (lVar16 < lVar19);
        }
        pcVar20 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)((long)&(((pCVar21->temp).s_max.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value +
                     local_350);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign(pcVar20,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_3c8.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign(pcVar20 + 1,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_3a8.ld);
      }
      else {
        lVar18 = (long)((this->u).row.len[local_380] + iVar11);
        lVar16 = lVar18 << 6;
        do {
          lVar15 = lVar16;
          if (lVar18 <= lVar19) goto LAB_0018955d;
          lVar10 = lVar18 + -1;
          lVar17 = lVar18 + -1;
          lVar18 = lVar10;
          lVar16 = lVar15 + -0x40;
        } while ((this->u).row.idx[lVar17] != iVar5);
        pnVar1 = (local_360->u).row.val.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_328.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value + lVar15));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_308.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value + lVar15 + 0x20));
        local_348 = (int)lVar10;
LAB_0018955d:
        pcVar20 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)((long)&(((local_360->temp).s_max.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value +
                     local_350);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_3c8.ld,pcVar20);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_3a8.ld,pcVar20 + 1);
      }
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_3c8.ld,local_2d0);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_2b8.ld,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_328.ld);
      local_378.arg1 = &local_409;
      local_378.arg2 = (type)&local_2b8;
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::
      number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  *)&local_408.ld,&local_378,(type *)0x0);
      lVar18 = local_2c0;
      iVar6 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)&local_408.ld,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)&local_3c8.ld);
      if ((local_3d3 == '\0') && (local_3d2 == '\0')) {
        operator_delete(local_3e8.ld.data,(ulong)local_3e8.ld.capacity << 3);
      }
      uVar14 = local_340;
      this = local_360;
      iVar5 = local_364;
      if ((local_3f3 == '\0') && (local_3f2 == '\0')) {
        operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
      }
      if ((local_283 == '\0') && (local_282 == '\0')) {
        operator_delete(local_290,(ulong)local_298 << 3);
      }
      if ((local_2a3 == '\0') && (local_2a2 == '\0')) {
        operator_delete(local_2b8.ld.data,(ulong)local_2b8.ld.capacity << 3);
      }
      lVar19 = local_2d8;
      if (0 < iVar6) {
        local_344 = local_348;
        local_368 = local_32c;
        local_358 = CONCAT44(local_358._4_4_,local_330);
        if (local_330 <= local_334) {
          local_358 = CONCAT44(local_358._4_4_,local_330);
          iVar6 = local_348;
          break;
        }
      }
    }
    lVar18 = lVar18 + -1;
    iVar6 = local_344;
  } while (lVar19 < lVar18);
LAB_0018a64b:
  pPVar9 = (this->temp).pivot_col;
  pPVar13 = pPVar9[iVar5].next;
  pPVar12 = pPVar9[iVar5].prev;
  pPVar13->prev = pPVar12;
  pPVar12->next = pPVar13;
  pPVar9[iVar5].next = pPVar9 + iVar5;
  pPVar9[iVar5].prev = pPVar9 + iVar5;
  if (-1 < iVar6) {
    lVar18 = (long)local_368;
    pPVar9 = (this->temp).pivot_row;
    pPVar9[lVar18].pos = iVar6 - (this->u).row.start[lVar18];
    iVar6 = ((int)uVar14 + -1) * ((int)local_358 + -1);
    pPVar9[lVar18].mkwtz = iVar6;
    pPVar13 = local_2c8;
    do {
      pPVar13 = pPVar13->next;
      if ((pPVar13->idx < 0) || (pPVar13->idx == local_368)) break;
    } while (pPVar13->mkwtz < iVar6);
    pPVar13 = pPVar13->prev;
    if (pPVar13->idx != local_368) {
      pPVar12 = pPVar9[lVar18].next;
      pPVar2 = pPVar9[lVar18].prev;
      pPVar12->prev = pPVar2;
      pPVar2->next = pPVar12;
      pPVar12 = pPVar13->next;
      pPVar9[lVar18].next = pPVar12;
      pPVar12->prev = pPVar9 + lVar18;
      pPVar9[lVar18].prev = pPVar13;
      pPVar13->next = pPVar9 + lVar18;
    }
    uVar8 = (int)local_2e0 + 1;
    local_2e0 = (ulong)uVar8;
    if (local_338 <= (int)uVar8) {
      if ((local_2f3 == '\0') && (local_2f2 == '\0')) {
        operator_delete(local_308.ld.data,(ulong)local_308.ld.capacity << 3);
      }
      if ((local_313 == '\0') && (local_312 == '\0')) {
        operator_delete(local_328.ld.data,(ulong)local_328.ld.capacity << 3);
      }
      if ((local_394._1_1_ == '\0') && (local_392 == '\0')) {
        operator_delete(local_3a8.ld.data,(local_3a8.la[0] & 0xffffffff) << 3);
      }
      if ((local_3b4._1_1_ == '\0') && (local_3b2 == '\0')) {
        operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
      }
      return;
    }
  }
  goto LAB_00189190;
}

Assistant:

inline void CLUFactorRational::selectPivots(const Rational& threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   Rational l_maxabs;
   Rational x = 0; // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if(temp.s_max[rw] < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }
         else
            l_maxabs = temp.s_max[rw];

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactorRational::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}